

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptElement *element)

{
  ScriptOperator *this_00;
  ScriptElement *element_local;
  ScriptElement *this_local;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_009f7e58;
  this->type_ = element->type_;
  this_00 = &this->op_code_;
  ScriptOperator::ScriptOperator(this_00,&element->op_code_);
  ByteData::ByteData((ByteData *)this,(ByteData *)this_00);
  this->value_ = element->value_;
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptElement& element)
    : type_(element.type_),
      op_code_(element.op_code_),
      binary_data_(element.binary_data_),
      value_(element.value_) {
  // do nothing
}